

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ordermatch.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  ostream *poVar2;
  string value;
  string file;
  string local_528;
  SessionSettings settings;
  Application application;
  SessionSettings local_3e8;
  ScreenLogFactory logFactory;
  FileStoreFactory storeFactory;
  SocketAcceptor acceptor;
  
  if (argc != 2) {
    poVar2 = std::operator<<((ostream *)&std::cout,"usage: ");
    poVar2 = std::operator<<(poVar2,*argv);
    poVar2 = std::operator<<(poVar2," FILE.");
    std::endl<char,std::char_traits<char>>(poVar2);
    return 0;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&file,argv[1],(allocator<char> *)&acceptor);
  FIX::SessionSettings::SessionSettings(&settings,(string *)&file,false);
  Application::Application(&application);
  FIX::FileStoreFactory::FileStoreFactory(&storeFactory,&settings);
  FIX::SessionSettings::SessionSettings(&local_3e8,&settings);
  FIX::ScreenLogFactory::ScreenLogFactory(&logFactory,&local_3e8);
  FIX::SessionSettings::~SessionSettings(&local_3e8);
  FIX::SocketAcceptor::SocketAcceptor
            (&acceptor,&application.super_Application,(MessageStoreFactory *)&storeFactory,&settings
             ,(LogFactory *)&logFactory);
  FIX::Acceptor::start();
  do {
    value._M_dataplus._M_p = (pointer)&value.field_2;
    value._M_string_length = 0;
    value.field_2._M_local_buf[0] = '\0';
    std::operator>>((istream *)&std::cin,(string *)&value);
    bVar1 = std::operator==(&value,"#symbols");
    if (bVar1) {
      OrderMatcher::display(&application.m_orderMatcher);
    }
    else {
      bVar1 = std::operator==(&value,"#quit");
      if (bVar1) {
        std::__cxx11::string::~string((string *)&value);
        FIX::Acceptor::stop(false);
        FIX::SocketAcceptor::~SocketAcceptor(&acceptor);
        FIX::ScreenLogFactory::~ScreenLogFactory(&logFactory);
        FIX::FileStoreFactory::~FileStoreFactory(&storeFactory);
        Application::~Application(&application);
        FIX::SessionSettings::~SessionSettings(&settings);
        std::__cxx11::string::~string((string *)&file);
        return 0;
      }
      std::__cxx11::string::string((string *)&local_528,(string *)&value);
      OrderMatcher::display(&application.m_orderMatcher,&local_528);
      std::__cxx11::string::~string((string *)&local_528);
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::__cxx11::string::~string((string *)&value);
  } while( true );
}

Assistant:

int main(int argc, char **argv) {
  if (argc != 2) {
    std::cout << "usage: " << argv[0] << " FILE." << std::endl;
    return 0;
  }
  std::string file = argv[1];

  try {
    FIX::SessionSettings settings(file);

    Application application;
    FIX::FileStoreFactory storeFactory(settings);
    FIX::ScreenLogFactory logFactory(settings);
    FIX::SocketAcceptor acceptor(application, storeFactory, settings, logFactory);

    acceptor.start();
    while (true) {
      std::string value;
      std::cin >> value;

      if (value == "#symbols") {
        application.orderMatcher().display();
      } else if (value == "#quit") {
        break;
      } else {
        application.orderMatcher().display(value);
      }

      std::cout << std::endl;
    }
    acceptor.stop();
    return 0;
  } catch (std::exception &e) {
    std::cout << e.what() << std::endl;
    return 1;
  }
}